

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbifnet.cpp
# Opt level: O0

void CVmBifNet::get_event(uint oargc)

{
  int iVar1;
  vm_val_t *pvVar2;
  undefined8 *puVar3;
  long *plVar4;
  CVmObject *pCVar5;
  CVmRun *this;
  int in_EDI;
  int evt_code;
  char *err;
  err_frame_t err_cur__;
  TadsEventMessage *evtmsg;
  int wret;
  TadsMessage *msg;
  int argc;
  vm_obj_id_t ev_cl;
  long timeout;
  uint in_stack_fffffffffffffebc;
  CVmRun *in_stack_fffffffffffffec0;
  void *pvVar6;
  char *in_stack_fffffffffffffec8;
  undefined8 uVar7;
  uint argc_00;
  uchar **in_stack_fffffffffffffee0;
  uint local_110 [2];
  undefined8 local_108;
  void *local_100;
  __jmp_buf_tag _Stack_f8;
  long *local_30;
  __pid_t local_24;
  long *local_20;
  uint local_18;
  vm_obj_id_t local_14;
  void *local_10;
  int local_4;
  
  local_4 = in_EDI;
  CVmBif::check_argc_range
            ((uint)((ulong)in_stack_fffffffffffffec0 >> 0x20),(uint)in_stack_fffffffffffffec0,
             in_stack_fffffffffffffebc);
  local_10 = (void *)0xffffffffffffffff;
  if (local_4 != 0) {
    pvVar2 = CVmStack::get(0);
    if (pvVar2->typ == VM_NIL) {
      CVmStack::discard();
    }
    else {
      iVar1 = CVmBif::pop_int_val();
      local_10 = (void *)(long)iVar1;
    }
  }
  local_14 = G_predef_X.net_event;
  local_20 = (long *)0x0;
  local_24 = TadsMessageQueue::wait(G_net_queue_X,local_10);
  if ((local_20 == (long *)0x0) ||
     (iVar1 = strcmp((char *)local_20[2],"TadsEventMessage"), plVar4 = local_20, iVar1 != 0)) {
    plVar4 = (long *)0x0;
  }
  local_30 = plVar4;
  puVar3 = (undefined8 *)_ZTW11G_err_frame();
  argc_00 = (uint)((ulong)plVar4 >> 0x20);
  local_108 = *puVar3;
  plVar4 = (long *)_ZTW11G_err_frame();
  *plVar4 = (long)local_110;
  local_110[0] = _setjmp(&_Stack_f8);
  if (local_110[0] != 0) goto LAB_002511df;
  this = (CVmRun *)(ulong)(local_24 + 2);
  switch(this) {
  case (CVmRun *)0x0:
  default:
switchD_00251072_default:
    CVmRun::push_string(this,in_stack_fffffffffffffec8);
    CVmRun::throw_new_class
              (this,(vm_obj_id_t)((ulong)in_stack_fffffffffffffec8 >> 0x20),
               (uint)in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0);
    break;
  case (CVmRun *)0x1:
    local_14 = G_predef_X.net_timeout_event;
    local_18 = 1;
    CVmRun::push_int(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
    break;
  case (CVmRun *)0x2:
    if (local_30 == (long *)0x0) goto switchD_00251072_default;
    local_14 = (**(code **)(*local_30 + 0x10))(local_30,&local_18,&stack0xfffffffffffffee4);
    CVmRun::push_int(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
    local_18 = local_18 + 1;
    break;
  case (CVmRun *)0x3:
    goto switchD_00251072_default;
  case (CVmRun *)0x4:
    local_18 = 1;
    CVmRun::push_int(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
  }
  if (local_14 == 0) {
    local_14 = G_predef_X.net_event;
  }
  if (local_14 == 0) {
    CVmObjList::create_from_stack(in_stack_fffffffffffffee0,argc_00);
    CVmBif::retval_obj(0);
  }
  else {
    pCVar5 = vm_objp(0);
    (*pCVar5->_vptr_CVmObject[3])(pCVar5,(ulong)local_14,0,(ulong)local_18);
  }
LAB_002511df:
  if (((local_110[0] & 0x8000) == 0) &&
     (local_110[0] = local_110[0] | 0x8000, local_20 != (long *)0x0)) {
    CVmRefCntObj::release_ref((CVmRefCntObj *)in_stack_fffffffffffffec0);
  }
  uVar7 = local_108;
  puVar3 = (undefined8 *)_ZTW11G_err_frame();
  *puVar3 = uVar7;
  if ((local_110[0] & 0x4001) != 0) {
    puVar3 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(uint *)*puVar3 & 2) != 0) {
      plVar4 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar4 + 0x10));
    }
    pvVar6 = local_100;
    plVar4 = (long *)_ZTW11G_err_frame();
    *(void **)(*plVar4 + 0x10) = pvVar6;
    err_rethrow();
  }
  if ((local_110[0] & 2) != 0) {
    free(local_100);
  }
  return;
}

Assistant:

void CVmBifNet::get_event(VMG_ uint oargc)
{
    /* check arguments */
    check_argc_range(vmg_ oargc, 0, 1);

    /* get the timeout, if present */
    long timeout = OS_FOREVER;
    if (oargc >= 1)
    {
        if (G_stk->get(0)->typ == VM_NIL)
            G_stk->discard();
        else
            timeout = pop_int_val(vmg0_);
    }

    /* we don't know the NetEvent subclass yet, so presume the base class */
    vm_obj_id_t ev_cl = G_predef->net_event;
    int argc;

    /* get the next message */
    TadsMessage *msg = 0;
    int wret = G_net_queue->wait(vmg_ timeout, &msg);

    /* cast the message */
    TadsEventMessage *evtmsg = cast_tads_message(TadsEventMessage, msg);

    /* make sure we release the message before exiting */
    err_try
    {
        /* check the wait result */
        const char *err;
        switch (wret)
        {
        case OSWAIT_EVENT + 0:
            /* we got a message */
            if (evtmsg != 0)
            {
                /* ask the message to set up a new NetRequestEvent */
                int evt_code;
                ev_cl = evtmsg->prep_event_obj(vmg_ &argc, &evt_code);
            
                /* add the event type argument */
                G_interpreter->push_int(vmg_ evt_code);
                ++argc;
            }
            else
            {
                /* unrecognized message type */
                err = "getNetEvent(): unexpected message type in queue";
                goto evt_error;
            }
            break;

        case OSWAIT_EVENT + 1:
            /* 'quit' event - return an error */
            err = "getNetEvent(): queue terminated";
            goto evt_error;

        case OSWAIT_EVENT + 2:
            /* debug break - return a NetEvent with the interrupt code */
            argc = 1;
            G_interpreter->push_int(vmg_ VMBN_EVT_DBGBRK);
            break;
            
        case OSWAIT_TIMEOUT:
            /* the timeout expired - return a NetTimeoutEvent */
            ev_cl = G_predef->net_timeout_event;
            argc = 1;
            G_interpreter->push_int(vmg_ VMBN_EVT_TIMEOUT);
            break;

        case OSWAIT_ERROR:
        default:
            /* the wait failed */
            err = "getNetEvent(): error waiting for request message";

        evt_error:
            /* on error, throw a NetException describing the problem */
            G_interpreter->push_string(vmg_ err);
            G_interpreter->throw_new_class(
                vmg_ G_predef->net_exception, 1, err);
            AFTER_ERR_THROW(break;)
        }
        
        /* 
         *   if the specific event type subclass isn't defined, fall back on
         *   the base NetEvent class 
         */
        if (ev_cl == VM_INVALID_OBJ)
            ev_cl = G_predef->net_event;

        /* 
         *   construct the NetEvent subclass, or a generic list if we don't
         *   even have the NetEvent class defined 
         */
        if (ev_cl != VM_INVALID_OBJ)
            vm_objp(vmg_ ev_cl)->create_instance(vmg_ ev_cl, 0, argc);
        else
            retval_obj(vmg_ CVmObjList::create_from_stack(vmg_ 0, argc));
    }